

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  int iVar39;
  uint uVar40;
  undefined4 uVar41;
  uint extraout_EAX;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  int iVar45;
  ulong uVar46;
  long lVar47;
  secp256k1_modinv32_signed30 *b;
  uint uVar48;
  int extraout_EDX;
  uint uVar49;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv32_signed30 *a;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar50;
  long lVar51;
  secp256k1_modinv32_signed30 *b_00;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  uint uVar57;
  secp256k1_modinv32_signed30 *unaff_RBX;
  int *piVar58;
  secp256k1_modinv32_signed30 *psVar59;
  secp256k1_fe *psVar60;
  uint uVar61;
  ulong unaff_RBP;
  long lVar62;
  secp256k1_fe *psVar63;
  ulong uVar64;
  secp256k1_fe *psVar65;
  secp256k1_fe *a_00;
  secp256k1_modinv32_signed30 *psVar66;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar67;
  ulong uVar68;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  ulong uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  uint uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  uint uVar81;
  int *piVar82;
  uint uVar83;
  secp256k1_modinv32_modinfo *unaff_R12;
  secp256k1_modinv32_modinfo *psVar84;
  secp256k1_modinv32_signed30 *psVar85;
  code *pcVar86;
  ulong uVar87;
  secp256k1_modinv32_signed30 *psVar88;
  secp256k1_modinv32_signed30 *unaff_R14;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  code *pcVar92;
  code *pcVar93;
  bool bVar94;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar95 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  uint32_t c1;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 e;
  uchar auStack_458 [40];
  secp256k1_fe *psStack_430;
  code *pcStack_428;
  ulong uStack_420;
  secp256k1_fe *psStack_418;
  code *pcStack_410;
  secp256k1_fe *psStack_408;
  code *pcStack_3f8;
  undefined1 auStack_3f0 [32];
  secp256k1_fe sStack_3d0;
  undefined1 auStack_3a0 [16];
  undefined1 auStack_388 [48];
  undefined8 uStack_358;
  secp256k1_fe *psStack_350;
  undefined8 uStack_348;
  code *pcStack_340;
  secp256k1_fe sStack_338;
  secp256k1_fe sStack_308;
  secp256k1_fe sStack_2d8;
  ulong uStack_2a0;
  ulong uStack_298;
  ulong uStack_290;
  secp256k1_modinv32_signed30 *psStack_288;
  ulong uStack_280;
  code *pcStack_278;
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  secp256k1_modinv32_signed30 *psStack_258;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  uint uStack_240;
  int32_t iStack_23c;
  secp256k1_modinv32_signed30 *psStack_238;
  secp256k1_modinv32_signed30 *psStack_230;
  secp256k1_modinv32_signed30 *psStack_228;
  secp256k1_modinv32_signed30 *psStack_220;
  secp256k1_modinv32_signed30 *psStack_218;
  code *pcStack_210;
  long lStack_200;
  long lStack_1f8;
  int *piStack_1f0;
  secp256k1_modinv32_modinfo *psStack_1e8;
  ulong uStack_1e0;
  ulong uStack_1d0;
  code *pcStack_1c8;
  secp256k1_modinv32_signed30 *psStack_1c0;
  int *piStack_1b0;
  secp256k1_modinv32_modinfo *psStack_1a8;
  ulong uStack_1a0;
  ulong uStack_190;
  code *pcStack_188;
  secp256k1_modinv32_signed30 sStack_180;
  secp256k1_modinv32_signed30 sStack_15c;
  secp256k1_modinv32_signed30 *psStack_138;
  secp256k1_modinv32_signed30 *psStack_130;
  secp256k1_modinv32_modinfo *local_120;
  uint local_114;
  uint local_110;
  uint local_10c;
  secp256k1_modinv32_signed30 local_108;
  secp256k1_modinv32_trans2x2 local_d8;
  secp256k1_modinv32_signed30 local_c8;
  secp256k1_modinv32_signed30 *local_98;
  long local_90;
  secp256k1_modinv32_signed30 local_88;
  secp256k1_modinv32_signed30 local_58;
  
  uVar44 = 0;
  local_88.v[8] = 0;
  local_88.v[4] = 0;
  local_88.v[5] = 0;
  local_88.v[6] = 0;
  local_88.v[7] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[8] = 0;
  local_58.v[4] = 0;
  local_58.v[5] = 0;
  local_58.v[6] = 0;
  local_58.v[7] = 0;
  local_58.v[0] = 1;
  local_58.v[1] = 0;
  local_108.v[8] = (modinfo->modulus).v[8];
  local_108.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_108.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_108.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_108.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_c8.v[8] = x->v[8];
  local_c8.v._0_8_ = *(undefined8 *)x->v;
  local_c8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_c8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_c8.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar91 = 0xffffffff;
  local_120 = modinfo;
  local_98 = x;
  do {
    local_90 = (long)local_108.v[0];
    uVar87 = (ulong)local_c8.v[0];
    uVar46 = 0;
    psVar66 = (secp256k1_modinv32_signed30 *)0x1;
    uVar49 = 0;
    uVar48 = 0;
    uVar71 = 1;
    uVar76 = local_c8.v[0];
    uVar81 = local_108.v[0];
    do {
      uVar40 = local_108.v[0];
      local_114 = uVar44;
      if ((uVar81 & 1) == 0) {
        psStack_130 = (secp256k1_modinv32_signed30 *)0x156ef4;
        secp256k1_modinv32_cold_17();
LAB_00156ef4:
        psStack_130 = (secp256k1_modinv32_signed30 *)0x156ef9;
        secp256k1_modinv32_cold_1();
LAB_00156ef9:
        psStack_130 = (secp256k1_modinv32_signed30 *)0x156efe;
        secp256k1_modinv32_cold_2();
        psVar84 = unaff_R12;
LAB_00156efe:
        psStack_130 = (secp256k1_modinv32_signed30 *)0x156f03;
        secp256k1_modinv32_cold_16();
        goto LAB_00156f03;
      }
      uVar72 = (uint)psVar66;
      uVar61 = uVar49 * local_c8.v[0] + uVar72 * local_108.v[0];
      unaff_RBP = (ulong)uVar61;
      uVar57 = uVar81 << ((byte)uVar46 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar57;
      if (uVar61 != uVar57) goto LAB_00156ef4;
      uVar61 = uVar71 * local_c8.v[0] + uVar48 * local_108.v[0];
      unaff_RBP = (ulong)uVar61;
      uVar57 = uVar76 << ((byte)uVar46 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar57;
      if (uVar61 != uVar57) goto LAB_00156ef9;
      local_10c = (int)(uint)uVar91 >> 0x1f;
      unaff_RBP = (ulong)local_10c;
      local_110 = uVar76 & 1;
      uVar57 = -local_110;
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)uVar57;
      uVar61 = local_10c & uVar57;
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar61;
      uVar89 = (uint)uVar91 ^ uVar61;
      uVar91 = (ulong)uVar89;
      psVar84 = (secp256k1_modinv32_modinfo *)(ulong)(uVar89 - 0x25b);
      if (uVar89 - 0x25b < 0xfffffb4d) goto LAB_00156efe;
      uVar91 = (ulong)(uVar89 - 1);
      uVar71 = uVar71 + ((local_10c ^ uVar49) - local_10c & uVar57);
      uVar49 = (uVar49 + (uVar71 & uVar61)) * 2;
      uVar48 = uVar48 + ((local_10c ^ uVar72) - local_10c & uVar57);
      uVar72 = (uVar72 + (uVar48 & uVar61)) * 2;
      psVar66 = (secp256k1_modinv32_signed30 *)(ulong)uVar72;
      uVar57 = ((local_10c ^ uVar81) - local_10c & uVar57) + uVar76;
      uVar76 = uVar57 >> 1;
      uVar57 = uVar57 & uVar61;
      unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)uVar57;
      uVar81 = uVar81 + uVar57;
      uVar57 = (int)uVar46 + 1;
      uVar46 = (ulong)uVar57;
    } while (uVar57 != 0x1e);
    unaff_RBX = (secp256k1_modinv32_signed30 *)(long)(int)uVar72;
    unaff_R14 = (secp256k1_modinv32_signed30 *)(long)(int)uVar71;
    unaff_RBP = (ulong)(int)uVar49;
    psVar84 = (secp256k1_modinv32_modinfo *)(long)(int)uVar48;
    uVar46 = (long)unaff_RBX * (long)unaff_R14 - unaff_RBP * (long)psVar84;
    local_d8.u = uVar72;
    local_d8.v = uVar49;
    local_d8.q = uVar48;
    local_d8.r = uVar71;
    if (uVar46 != 0x40000000) {
LAB_00156f03:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f08;
      secp256k1_modinv32_cold_3();
LAB_00156f08:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f0d;
      secp256k1_modinv32_cold_15();
LAB_00156f0d:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f12;
      secp256k1_modinv32_cold_14();
LAB_00156f12:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f17;
      secp256k1_modinv32_cold_13();
LAB_00156f17:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f1c;
      secp256k1_modinv32_cold_12();
LAB_00156f1c:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f21;
      secp256k1_modinv32_cold_4();
LAB_00156f21:
      unaff_R12 = psVar84;
      uVar44 = (uint)uVar46;
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f26;
      secp256k1_modinv32_cold_5();
LAB_00156f26:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f2b;
      secp256k1_modinv32_cold_11();
LAB_00156f2b:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f30;
      secp256k1_modinv32_cold_10();
LAB_00156f30:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f35;
      secp256k1_modinv32_cold_9();
LAB_00156f35:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156f3a;
      secp256k1_modinv32_cold_8();
      goto LAB_00156f3a;
    }
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156c07;
    secp256k1_modinv32_update_de_30(&local_88,&local_58,&local_d8,local_120);
    psVar66 = &local_108;
    uVar40 = 9;
    uVar46 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156c20;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,&local_120->modulus,-1);
    if (iVar39 < 1) goto LAB_00156f08;
    psVar66 = &local_108;
    uVar40 = 9;
    uVar46 = 1;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156c41;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,&local_120->modulus,1);
    if (0 < iVar39) goto LAB_00156f0d;
    psVar66 = &local_c8;
    uVar40 = 9;
    uVar46 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156c62;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,&local_120->modulus,-1);
    if (iVar39 < 1) goto LAB_00156f12;
    psVar66 = &local_c8;
    uVar40 = 9;
    uVar46 = 1;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156c83;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,&local_120->modulus,1);
    unaff_R12 = local_120;
    if (-1 < iVar39) goto LAB_00156f17;
    uVar46 = (long)unaff_RBX * local_90;
    uVar42 = unaff_RBP * uVar87 + uVar46;
    if ((uVar42 & 0x3ffffffe) != 0) goto LAB_00156f1c;
    uVar87 = uVar87 * (long)unaff_R14 + local_90 * (long)psVar84;
    if ((uVar87 & 0x3fffffff) != 0) goto LAB_00156f21;
    uVar87 = (long)uVar87 >> 0x1e;
    lVar43 = (long)uVar42 >> 0x1e;
    lVar47 = 1;
    do {
      lVar43 = (long)local_c8.v[lVar47] * unaff_RBP +
               (long)local_108.v[lVar47] * (long)unaff_RBX + lVar43;
      lVar62 = (long)local_c8.v[lVar47] * (long)unaff_R14 +
               (long)local_108.v[lVar47] * (long)psVar84 + uVar87;
      (&local_10c)[lVar47] = (uint)lVar43 & 0x3fffffff;
      local_c8.v[lVar47 + -1] = (uint)lVar62 & 0x3fffffff;
      lVar47 = lVar47 + 1;
      uVar87 = lVar62 >> 0x1e;
      lVar43 = lVar43 >> 0x1e;
    } while (lVar47 != 9);
    local_108.v[8] = (int32_t)lVar43;
    local_c8.v[8] = (int32_t)uVar87;
    unaff_RBX = &local_108;
    uVar40 = 9;
    uVar44 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156d57;
    psVar66 = unaff_RBX;
    iVar39 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_120->modulus,-1);
    if (iVar39 < 1) goto LAB_00156f26;
    uVar40 = 9;
    uVar44 = 1;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156d74;
    psVar66 = unaff_RBX;
    iVar39 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&unaff_R12->modulus,1);
    if (0 < iVar39) goto LAB_00156f2b;
    unaff_RBX = &local_c8;
    uVar40 = 9;
    uVar44 = 0xffffffff;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156d96;
    psVar66 = unaff_RBX;
    iVar39 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&unaff_R12->modulus,-1);
    if (iVar39 < 1) goto LAB_00156f30;
    uVar40 = 9;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156db3;
    psVar66 = unaff_RBX;
    iVar39 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&unaff_R12->modulus,1);
    uVar44 = local_114;
    if (-1 < iVar39) goto LAB_00156f35;
    uVar44 = local_114 + 1;
  } while (uVar44 != 0x14);
  psVar66 = &local_c8;
  uVar40 = 9;
  uVar44 = 0;
  psStack_130 = (secp256k1_modinv32_signed30 *)0x156de2;
  iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar39 == 0) {
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156e05;
    iVar39 = secp256k1_modinv32_mul_cmp_30(&local_108,9,&SECP256K1_SIGNED30_ONE,-1);
    unaff_R14 = local_98;
    if (iVar39 == 0) {
LAB_00156eaf:
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156ec6;
      secp256k1_modinv32_normalize_30(&local_88,local_108.v[8],unaff_R12);
      unaff_R14->v[8] = local_88.v[8];
      *(undefined8 *)(unaff_R14->v + 4) = local_88.v._16_8_;
      *(undefined8 *)(unaff_R14->v + 6) = local_88.v._24_8_;
      *(undefined8 *)unaff_R14->v = local_88.v._0_8_;
      *(undefined8 *)(unaff_R14->v + 2) = local_88.v._8_8_;
      return;
    }
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156e30;
    iVar39 = secp256k1_modinv32_mul_cmp_30(&local_108,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar39 == 0) goto LAB_00156eaf;
    uVar40 = 9;
    uVar44 = 0;
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156e4a;
    psVar66 = unaff_R14;
    iVar39 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar39 == 0) {
      psVar66 = &local_88;
      uVar40 = 9;
      uVar44 = 0;
      psStack_130 = (secp256k1_modinv32_signed30 *)0x156e6d;
      iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar39 == 0) {
        psStack_130 = (secp256k1_modinv32_signed30 *)0x156e8c;
        iVar39 = secp256k1_modinv32_mul_cmp_30(&local_108,9,&unaff_R12->modulus,1);
        if (iVar39 == 0) goto LAB_00156eaf;
        psVar66 = &local_108;
        uVar40 = 9;
        uVar44 = 0xffffffff;
        psStack_130 = (secp256k1_modinv32_signed30 *)0x156ea7;
        iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,&unaff_R12->modulus,-1);
        if (iVar39 == 0) goto LAB_00156eaf;
      }
    }
  }
  else {
LAB_00156f3a:
    psStack_130 = (secp256k1_modinv32_signed30 *)0x156f3f;
    secp256k1_modinv32_cold_6();
  }
  psStack_130 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_180;
  piVar58 = (int *)(ulong)uVar44;
  pcStack_188 = (code *)0x156f64;
  psStack_138 = unaff_RBX;
  psStack_130 = unaff_R14;
  secp256k1_modinv32_mul_30(&sStack_15c,psVar66,uVar40,1);
  pcStack_188 = (code *)0x156f76;
  piVar82 = piVar58;
  psVar66 = a;
  secp256k1_modinv32_mul_30(&sStack_180,a,9,uVar44);
  lVar43 = 0;
  while ((uint)sStack_15c.v[lVar43] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_180.v[lVar43]) goto LAB_00156fc8;
    lVar43 = lVar43 + 1;
    if (lVar43 == 8) {
      uVar44 = 8;
      while( true ) {
        if (sStack_15c.v[uVar44] < sStack_180.v[uVar44]) {
          return;
        }
        if (sStack_180.v[uVar44] < sStack_15c.v[uVar44]) break;
        bVar94 = uVar44 == 0;
        uVar44 = uVar44 - 1;
        if (bVar94) {
          return;
        }
      }
      return;
    }
  }
  pcStack_188 = (code *)0x156fc8;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00156fc8:
  pcStack_188 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar39 = (int)a_01;
  piStack_1b0 = piVar58;
  psStack_1a8 = unaff_R12;
  uStack_1a0 = uVar87;
  uStack_190 = uVar91;
  pcStack_188 = (code *)unaff_RBP;
  if (iVar39 < 1) {
    psStack_1c0 = (secp256k1_modinv32_signed30 *)0x1570bb;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_001570bb:
    iVar45 = (int)piVar82;
    psStack_1c0 = (secp256k1_modinv32_signed30 *)0x1570c0;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar1 = piVar82[1];
    iVar2 = *piVar82;
    piVar58 = (int *)(long)psVar66->v[0];
    uVar46 = (long)*extraout_RDX * (long)iVar1 + (long)piVar58 * (long)iVar2;
    if ((uVar46 & 0x3fffffff) != 0) goto LAB_001570bb;
    iVar3 = piVar82[3];
    iVar45 = piVar82[2];
    piVar58 = (int *)((long)piVar58 * (long)iVar45);
    piVar82 = (int *)((long)*extraout_RDX * (long)iVar3 + (long)piVar58);
    if (((ulong)piVar82 & 0x3fffffff) == 0) {
      lVar47 = (long)piVar82 >> 0x1e;
      lVar43 = (long)uVar46 >> 0x1e;
      if (iVar39 != 1) {
        uVar91 = 1;
        do {
          lVar43 = (long)extraout_RDX[uVar91] * (long)iVar1 +
                   (long)psVar66->v[uVar91] * (long)iVar2 + lVar43;
          lVar47 = (long)extraout_RDX[uVar91] * (long)iVar3 +
                   (long)psVar66->v[uVar91] * (long)iVar45 + lVar47;
          psVar66->v[uVar91 - 1] = (uint)lVar43 & 0x3fffffff;
          extraout_RDX[uVar91 - 1] = (uint)lVar47 & 0x3fffffff;
          uVar91 = uVar91 + 1;
          lVar47 = lVar47 >> 0x1e;
          lVar43 = lVar43 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar91);
      }
      psVar66->v[(long)iVar39 + -1] = (int32_t)lVar43;
      extraout_RDX[(long)iVar39 + -1] = (int)lVar47;
      return;
    }
  }
  psStack_1c0 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar43 = 0;
  psStack_1c0 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar43 < extraout_EDX) {
      psStack_1c0 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_1c0->v + (long)psVar66->v[lVar43] * (long)iVar45);
    }
    a_01->v[lVar43] = (uint)psStack_1c0 & 0x3fffffff;
    psStack_1c0 = (secp256k1_modinv32_signed30 *)((long)psStack_1c0 >> 0x1e);
    lVar43 = lVar43 + 1;
  } while (lVar43 != 8);
  if (8 < extraout_EDX) {
    psStack_1c0 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_1c0->v + (long)psVar66->v[8] * (long)iVar45);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_1c0;
  if (b == psStack_1c0) {
    a_01->v[8] = (int)psStack_1c0;
    return;
  }
  pcStack_1c8 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar44 = *extraout_RDX_00;
  psVar88 = (secp256k1_modinv32_signed30 *)(long)(int)uVar44;
  uVar49 = extraout_RDX_00[1];
  lVar43 = (long)(int)uVar49;
  uVar76 = extraout_RDX_00[2];
  psVar59 = (secp256k1_modinv32_signed30 *)(long)(int)uVar76;
  lStack_200 = (long)(int)extraout_RDX_00[3];
  psVar63 = (secp256k1_fe *)0x9;
  pcStack_210 = (code *)0x15715a;
  a_02 = a_01;
  piStack_1f0 = piVar58;
  psStack_1e8 = unaff_R12;
  uStack_1e0 = uVar87;
  uStack_1d0 = uVar91;
  pcStack_1c8 = (code *)unaff_RBP;
  iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar39 < 1) {
    pcStack_210 = (code *)0x1573c2;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_001573c2:
    pcStack_210 = (code *)0x1573c7;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_001573c7:
    pcStack_210 = (code *)0x1573cc;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_001573cc:
    pcStack_210 = (code *)0x1573d1;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_001573d1:
    pcStack_210 = (code *)0x1573d6;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001573d6:
    pcStack_210 = (code *)0x1573db;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001573db:
    pcStack_210 = (code *)0x1573e0;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001573e0:
    pcStack_210 = (code *)0x1573e5;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar85 = b;
LAB_001573e5:
    pcStack_210 = (code *)0x1573ea;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001573ea:
    pcStack_210 = (code *)0x1573ef;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001573ef:
    pcStack_210 = (code *)0x1573f4;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x157177;
    a_02 = a_01;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar39) goto LAB_001573c2;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x157194;
    a_02 = psVar66;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,b,-2);
    if (iVar39 < 1) goto LAB_001573c7;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x1571b1;
    a_02 = psVar66;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,b,1);
    if (-1 < iVar39) goto LAB_001573cc;
    psVar85 = (secp256k1_modinv32_signed30 *)-(long)psVar88;
    if (0 < (long)psVar88) {
      psVar85 = psVar88;
    }
    lVar47 = -lVar43;
    if (lVar43 < 1) {
      lVar47 = lVar43;
    }
    if (lVar47 + 0x40000000 < (long)psVar85) goto LAB_001573d1;
    psVar85 = (secp256k1_modinv32_signed30 *)-(long)psVar59;
    if (0 < (long)psVar59) {
      psVar85 = psVar59;
    }
    lVar47 = -lStack_200;
    if (lStack_200 < 1) {
      lVar47 = lStack_200;
    }
    if (lVar47 + 0x40000000 < (long)psVar85) goto LAB_001573d6;
    uVar48 = a_01->v[8] >> 0x1f;
    uVar81 = psVar66->v[8] >> 0x1f;
    psVar63 = (secp256k1_fe *)(ulong)uVar81;
    iVar39 = (uVar81 & uVar49) + (uVar48 & uVar44);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar66->v[0] * lVar43 + (long)a_01->v[0] * (long)psVar88);
    lVar47 = (long)(int)(iVar39 - ((int)a_02 * b[1].v[0] + iVar39 & 0x3fffffffU));
    piVar50 = (int32_t *)((long)a_02->v + lVar47 * b->v[0]);
    if (((ulong)piVar50 & 0x3fffffff) != 0) goto LAB_001573db;
    lStack_1f8 = lVar47;
    iVar39 = (uVar81 & (uint)lStack_200) + (uVar48 & uVar76);
    lVar62 = psVar66->v[0] * lStack_200 + (long)a_01->v[0] * (long)psVar59;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar44 = iVar39 - (b[1].v[0] * (int)lVar62 + iVar39 & 0x3fffffffU);
    psVar63 = (secp256k1_fe *)(ulong)uVar44;
    uVar91 = (long)b->v[0] * (long)(int)uVar44 + lVar62;
    if ((uVar91 & 0x3fffffff) != 0) goto LAB_001573e0;
    lVar62 = (long)uVar91 >> 0x1e;
    lVar51 = (long)piVar50 >> 0x1e;
    lVar67 = 1;
    do {
      lVar51 = b->v[lVar67] * lVar47 + psVar66->v[lVar67] * lVar43 +
               (long)a_01->v[lVar67] * (long)psVar88 + lVar51;
      psVar85 = (secp256k1_modinv32_signed30 *)(psVar66->v[lVar67] * lStack_200);
      lVar62 = (long)psVar85->v +
               (long)a_01->v[lVar67] * (long)psVar59 + lVar62 +
               (long)b->v[lVar67] * (long)(int)uVar44;
      a_01->v[lVar67 + -1] = (uint)lVar51 & 0x3fffffff;
      psVar66->v[lVar67 + -1] = (uint)lVar62 & 0x3fffffff;
      lVar67 = lVar67 + 1;
      lVar62 = lVar62 >> 0x1e;
      lVar51 = lVar51 >> 0x1e;
    } while (lVar67 != 9);
    a_01->v[8] = (int32_t)lVar51;
    psVar66->v[8] = (int32_t)lVar62;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x15735b;
    a_02 = a_01;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar59 = psVar66;
    psVar88 = b;
    if (iVar39 < 1) goto LAB_001573e5;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x157378;
    a_02 = a_01;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar39) goto LAB_001573ea;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x157391;
    a_02 = psVar66;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,b,-2);
    if (iVar39 < 1) goto LAB_001573ef;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_210 = (code *)0x1573aa;
    a_02 = psVar66;
    iVar39 = secp256k1_modinv32_mul_cmp_30(psVar66,9,b,1);
    if (iVar39 < 0) {
      return;
    }
  }
  pcStack_210 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_210 = (code *)lVar43;
  psStack_218 = a_01;
  psStack_220 = psVar66;
  psStack_228 = psVar88;
  psStack_230 = psVar85;
  psStack_238 = psVar59;
  uVar44 = a_02->v[0];
  uVar64 = (ulong)uVar44;
  uVar49 = a_02->v[3];
  uVar42 = (ulong)uVar49;
  uVar76 = a_02->v[4];
  uVar46 = (ulong)uVar76;
  uVar81 = a_02->v[5];
  uVar87 = (ulong)uVar81;
  psVar66 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar48 = a_02->v[7];
  uVar91 = (ulong)uVar48;
  iStack_23c = a_02->v[8];
  lVar43 = 0;
  do {
    if (a_02->v[lVar43] < -0x3fffffff) {
      pcStack_278 = (code *)0x157742;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00157742:
      pcStack_278 = (code *)0x157747;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00157747;
    }
    if (0x3fffffff < a_02->v[lVar43]) goto LAB_00157742;
    lVar43 = lVar43 + 1;
  } while (lVar43 != 9);
  uStack_25c = (uint)psVar63;
  psVar63 = (secp256k1_fe *)0x9;
  pcStack_278 = (code *)0x15747f;
  psVar66 = a_02;
  uStack_268 = a_02->v[1];
  uStack_264 = a_02->v[2];
  uStack_260 = a_02->v[6];
  psStack_258 = b_00;
  iVar39 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar39 < 1) {
LAB_00157747:
    pcStack_278 = (code *)0x15774c;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015774c:
    pcStack_278 = (code *)0x157751;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_00157751:
    pcStack_278 = (code *)0x157756;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00157756:
    pcStack_278 = (code *)0x15775b;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_278 = (code *)0x15749e;
    psVar66 = a_02;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_258,1);
    if (-1 < iVar39) goto LAB_0015774c;
    uVar71 = iStack_23c >> 0x1f;
    uStack_240 = psStack_258->v[1];
    uVar40 = (uVar71 & uStack_240) + uStack_268;
    uStack_268 = psStack_258->v[2];
    uVar57 = (uVar71 & uStack_268) + uStack_264;
    uStack_264 = psStack_258->v[3];
    uStack_244 = psStack_258->v[4];
    uStack_248 = psStack_258->v[5];
    uStack_24c = psStack_258->v[6];
    uVar89 = (uVar71 & uStack_24c) + uStack_260;
    uStack_260 = psStack_258->v[7];
    uStack_26c = (int)uStack_25c >> 0x1f;
    uStack_25c = psStack_258->v[8];
    uVar72 = ((uVar71 & psStack_258->v[0]) + uVar44 ^ uStack_26c) - uStack_26c;
    uVar61 = ((int)uVar72 >> 0x1e) + ((uVar40 ^ uStack_26c) - uStack_26c);
    uVar40 = ((int)uVar61 >> 0x1e) + ((uVar57 ^ uStack_26c) - uStack_26c);
    uVar90 = ((int)uVar40 >> 0x1e) + (((uVar71 & uStack_264) + uVar49 ^ uStack_26c) - uStack_26c);
    uVar49 = ((int)uVar90 >> 0x1e) + (((uVar71 & uStack_244) + uVar76 ^ uStack_26c) - uStack_26c);
    uVar44 = ((int)uVar49 >> 0x1e) + (((uVar71 & uStack_248) + uVar81 ^ uStack_26c) - uStack_26c);
    uVar76 = ((int)uVar44 >> 0x1e) + ((uVar89 ^ uStack_26c) - uStack_26c);
    uVar81 = ((int)uVar76 >> 0x1e) + (((uVar71 & uStack_260) + uVar48 ^ uStack_26c) - uStack_26c);
    uVar83 = ((int)uVar81 >> 0x1e) +
             (((uVar71 & uStack_25c) + iStack_23c ^ uStack_26c) - uStack_26c);
    uVar87 = (ulong)uVar83;
    uStack_270 = (int)uVar83 >> 0x1f;
    uVar89 = (psStack_258->v[0] & uStack_270) + (uVar72 & 0x3fffffff);
    uVar57 = (uStack_248 & uStack_270) + (uVar44 & 0x3fffffff);
    uVar64 = (ulong)uVar57;
    uVar72 = (uStack_24c & uStack_270) + (uVar76 & 0x3fffffff);
    uVar42 = (ulong)uVar72;
    uVar44 = ((int)uVar89 >> 0x1e) + (uStack_240 & uStack_270) + (uVar61 & 0x3fffffff);
    uVar76 = ((int)uVar44 >> 0x1e) + (uStack_268 & uStack_270) + (uVar40 & 0x3fffffff);
    uVar48 = ((int)uVar76 >> 0x1e) + (uStack_264 & uStack_270) + (uVar90 & 0x3fffffff);
    uVar71 = ((int)uVar48 >> 0x1e) + (uStack_244 & uStack_270) + (uVar49 & 0x3fffffff);
    uVar57 = ((int)uVar71 >> 0x1e) + uVar57;
    uVar72 = ((int)uVar57 >> 0x1e) + uVar72;
    uVar49 = ((int)uVar72 >> 0x1e) + (uStack_260 & uStack_270) + (uVar81 & 0x3fffffff);
    uVar81 = ((int)uVar49 >> 0x1e) + (uStack_25c & uStack_270) + uVar83;
    uVar46 = (ulong)uVar81;
    uVar48 = uVar48 & 0x3fffffff;
    psVar63 = (secp256k1_fe *)(ulong)uVar48;
    uVar71 = uVar71 & 0x3fffffff;
    psVar66 = (secp256k1_modinv32_signed30 *)(ulong)uVar71;
    uVar49 = uVar49 & 0x3fffffff;
    uVar91 = (ulong)uVar49;
    a_02->v[0] = uVar89 & 0x3fffffff;
    a_02->v[1] = uVar44 & 0x3fffffff;
    a_02->v[2] = uVar76 & 0x3fffffff;
    a_02->v[3] = uVar48;
    a_02->v[4] = uVar71;
    a_02->v[5] = uVar57 & 0x3fffffff;
    a_02->v[6] = uVar72 & 0x3fffffff;
    a_02->v[7] = uVar49;
    a_02->v[8] = uVar81;
    if (0x3fffffff < uVar81) goto LAB_00157751;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_278 = (code *)0x15770f;
    psVar66 = a_02;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_258,0);
    if (iVar39 < 0) goto LAB_00157756;
    psVar63 = (secp256k1_fe *)0x9;
    pcStack_278 = (code *)0x15772a;
    psVar66 = a_02;
    iVar39 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_258,1);
    if (iVar39 < 0) {
      return;
    }
  }
  pcStack_278 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  a_00 = &sStack_338;
  psVar60 = &sStack_338;
  pcVar86 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar86 = secp256k1_fe_inv;
  }
  pcStack_340 = (code *)0x157791;
  uStack_2a0 = uVar91;
  uStack_298 = uVar87;
  uStack_290 = uVar42;
  psStack_288 = a_02;
  uStack_280 = uVar64;
  pcStack_278 = (code *)uVar46;
  (*pcVar86)(&sStack_338);
  if (psVar66 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar66->v + 8) = sStack_338.n[4];
    *(ulong *)(psVar66[1].v + 1) = CONCAT44(sStack_338.normalized,sStack_338.magnitude);
    *(uint64_t *)(psVar66->v + 4) = sStack_338.n[2];
    *(uint64_t *)(psVar66->v + 6) = sStack_338.n[3];
    *(uint64_t *)psVar66->v = sStack_338.n[0];
    *(uint64_t *)(psVar66->v + 2) = sStack_338.n[1];
  }
  uVar87 = 0xffffffffffff;
  sStack_2d8.n[0] = psVar63->n[0];
  sStack_2d8.n[1] = psVar63->n[1];
  sStack_2d8.n[2] = psVar63->n[2];
  sStack_2d8.n[3] = psVar63->n[3];
  sStack_2d8.n[4] = psVar63->n[4];
  sStack_2d8.magnitude = psVar63->magnitude;
  sStack_2d8.normalized = psVar63->normalized;
  psVar65 = &sStack_2d8;
  pcStack_340 = (code *)0x1577fa;
  secp256k1_fe_verify(psVar65);
  uVar91 = 0x1000003d1;
  uVar46 = (sStack_2d8.n[4] >> 0x30) * 0x1000003d1 + sStack_2d8.n[0];
  if (((uVar46 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar46 & 0xfffffffffffff) == 0)) {
    uVar42 = (uVar46 >> 0x34) + sStack_2d8.n[1];
    uVar64 = (uVar42 >> 0x34) + sStack_2d8.n[2];
    uVar68 = (uVar64 >> 0x34) + sStack_2d8.n[3];
    uVar69 = (uVar68 >> 0x34) + (sStack_2d8.n[4] & 0xffffffffffff);
    if ((((uVar42 | uVar46 | uVar64 | uVar68) & 0xfffffffffffff) != 0 || uVar69 != 0) &&
       (((uVar46 | 0x1000003d0) & uVar42 & uVar64 & uVar68 & (uVar69 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_001578a1;
LAB_00157c6b:
    pcStack_340 = (code *)0x157c76;
    secp256k1_fe_verify(&sStack_338);
    uVar87 = sStack_338.n[4] & 0xffffffffffff;
    uVar46 = (sStack_338.n[4] >> 0x30) * 0x1000003d1 + sStack_338.n[0];
    uVar42 = (uVar46 >> 0x34) + sStack_338.n[1];
    uVar64 = (uVar42 >> 0x34) + sStack_338.n[2];
    a_00 = (secp256k1_fe *)((uVar64 >> 0x34) + sStack_338.n[3]);
    uVar68 = ((ulong)a_00 >> 0x34) + uVar87;
    if ((((uVar42 | uVar46 | uVar64 | (ulong)a_00) & 0xfffffffffffff) == 0 && uVar68 == 0) ||
       (r = (secp256k1_fe *)(uVar68 ^ 0xf000000000000), psVar60 = &sStack_338,
       ((uVar46 ^ 0x1000003d0) & uVar42 & uVar64 & (ulong)a_00 & (ulong)r) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_001578a1:
    pcStack_340 = (code *)0x1578b4;
    psVar65 = psVar63;
    secp256k1_fe_mul(&sStack_2d8,psVar63,&sStack_338);
    pcStack_340 = (code *)0x1578bc;
    secp256k1_fe_verify(&sStack_2d8);
    r = &fe_minus_one;
    pcStack_340 = (code *)0x1578c8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_2d8.magnitude < 0x20) {
      sStack_2d8.n[0] = sStack_2d8.n[0] + 0xffffefffffc2e;
      sStack_2d8.n[1] = sStack_2d8.n[1] + 0xfffffffffffff;
      sStack_2d8.n[2] = sStack_2d8.n[2] + 0xfffffffffffff;
      sStack_2d8.n[3] = sStack_2d8.n[3] + 0xfffffffffffff;
      sStack_2d8.n[4] = sStack_2d8.n[4] + 0xffffffffffff;
      sStack_2d8.normalized = 0;
      sStack_2d8.magnitude = sStack_2d8.magnitude + 1;
      pcStack_340 = (code *)0x15791a;
      secp256k1_fe_verify(&sStack_2d8);
      pcStack_340 = (code *)0x157922;
      secp256k1_fe_verify(&sStack_2d8);
      uVar46 = (sStack_2d8.n[4] >> 0x30) * 0x1000003d1 + sStack_2d8.n[0];
      uVar42 = (uVar46 >> 0x34) + sStack_2d8.n[1];
      uVar64 = (uVar42 >> 0x34) + sStack_2d8.n[2];
      psVar65 = (secp256k1_fe *)((uVar64 >> 0x34) + sStack_2d8.n[3]);
      uVar68 = ((ulong)psVar65 >> 0x34) + (sStack_2d8.n[4] & 0xffffffffffff);
      if ((((uVar42 | uVar46 | uVar64 | (ulong)psVar65) & 0xfffffffffffff) != 0 || uVar68 != 0) &&
         (r = (secp256k1_fe *)(uVar68 ^ 0xf000000000000),
         ((uVar46 ^ 0x1000003d0) & uVar42 & uVar64 & (ulong)psVar65 & (ulong)r) != 0xfffffffffffff))
      goto LAB_00157d09;
      sStack_308.n[0] = psVar63->n[0];
      sStack_308.n[1] = psVar63->n[1];
      sStack_308.n[2] = psVar63->n[2];
      sStack_308.n[3] = psVar63->n[3];
      sStack_308.n[4] = psVar63->n[4];
      sStack_308.magnitude = psVar63->magnitude;
      sStack_308.normalized = psVar63->normalized;
      psVar63 = &sStack_308;
      pcStack_340 = (code *)0x1579c8;
      secp256k1_fe_verify(psVar63);
      r = &fe_minus_one;
      pcStack_340 = (code *)0x1579d4;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_308.magnitude) goto LAB_00157d0e;
      sStack_308.n[0] = sStack_308.n[0] + 0xffffefffffc2e;
      sStack_308.n[1] = sStack_308.n[1] + 0xfffffffffffff;
      sStack_308.n[2] = sStack_308.n[2] + 0xfffffffffffff;
      sStack_308.n[3] = sStack_308.n[3] + 0xfffffffffffff;
      sStack_308.n[4] = sStack_308.n[4] + 0xffffffffffff;
      sStack_308.normalized = 0;
      sStack_308.magnitude = sStack_308.magnitude + 1;
      pcStack_340 = (code *)0x157a1f;
      secp256k1_fe_verify(&sStack_308);
      pcStack_340 = (code *)0x157a27;
      secp256k1_fe_verify(&sStack_308);
      uVar46 = (sStack_308.n[4] >> 0x30) * 0x1000003d1 + sStack_308.n[0];
      if (((uVar46 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar46 & 0xfffffffffffff) == 0)) {
        uVar42 = (uVar46 >> 0x34) + sStack_308.n[1];
        uVar64 = (uVar42 >> 0x34) + sStack_308.n[2];
        uVar68 = (uVar64 >> 0x34) + sStack_308.n[3];
        uVar69 = (uVar68 >> 0x34) + (sStack_308.n[4] & 0xffffffffffff);
        if (((uVar42 | uVar46 | uVar64 | uVar68) & 0xfffffffffffff) == 0 && uVar69 == 0) {
          return;
        }
        if (((uVar46 | 0x1000003d0) & uVar42 & uVar64 & uVar68 & (uVar69 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar65 = &sStack_308;
      pcStack_340 = (code *)0x157ad6;
      (*pcVar86)();
      pcStack_340 = (code *)0x157ae1;
      secp256k1_fe_verify(&sStack_338);
      r = &fe_minus_one;
      pcStack_340 = (code *)0x157aed;
      secp256k1_fe_verify(&fe_minus_one);
      psVar63 = &sStack_338;
      if (0x1f < sStack_338.magnitude) goto LAB_00157d13;
      sStack_338.n[0] = sStack_338.n[0] + 0xffffefffffc2e;
      sStack_338.n[1] = sStack_338.n[1] + 0xfffffffffffff;
      sStack_338.n[2] = sStack_338.n[2] + 0xfffffffffffff;
      sStack_338.n[3] = sStack_338.n[3] + 0xfffffffffffff;
      sStack_338.n[4] = sStack_338.n[4] + 0xffffffffffff;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      sStack_338.normalized = 0;
      pcStack_340 = (code *)0x157b36;
      secp256k1_fe_verify(&sStack_338);
      pcStack_340 = (code *)0x157b3f;
      (*pcVar86)(&sStack_338);
      pcStack_340 = (code *)0x157b47;
      secp256k1_fe_verify(&sStack_338);
      sStack_338.n[0] = sStack_338.n[0] + 1;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      sStack_338.normalized = 0;
      pcStack_340 = (code *)0x157b59;
      secp256k1_fe_verify(&sStack_338);
      pcStack_340 = (code *)0x157b61;
      secp256k1_fe_verify(&sStack_338);
      psVar65 = &sStack_308;
      pcStack_340 = (code *)0x157b6e;
      r = psVar65;
      secp256k1_fe_verify(psVar65);
      if (sStack_308.magnitude + sStack_338.magnitude < 0x21) {
        sStack_338.n[0] = sStack_338.n[0] + sStack_308.n[0];
        sStack_338.n[1] = sStack_338.n[1] + sStack_308.n[1];
        sStack_338.n[2] = sStack_338.n[2] + sStack_308.n[2];
        sStack_338.n[3] = sStack_338.n[3] + sStack_308.n[3];
        sStack_338.n[4] = sStack_338.n[4] + sStack_308.n[4];
        sStack_338.normalized = 0;
        pcStack_340 = (code *)0x157bba;
        sStack_338.magnitude = sStack_308.magnitude + sStack_338.magnitude;
        secp256k1_fe_verify(&sStack_338);
        pcStack_340 = (code *)0x157bc2;
        secp256k1_fe_verify(&sStack_338);
        uVar46 = (sStack_338.n[4] >> 0x30) * 0x1000003d1 + sStack_338.n[0];
        if (((uVar46 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar46 & 0xfffffffffffff) == 0)) {
          uVar87 = (uVar46 >> 0x34) + sStack_338.n[1];
          uVar42 = (uVar87 >> 0x34) + sStack_338.n[2];
          uVar64 = (uVar42 >> 0x34) + sStack_338.n[3];
          uVar68 = (uVar64 >> 0x34) + (sStack_338.n[4] & 0xffffffffffff);
          if (((uVar87 | uVar46 | uVar42 | uVar64) & 0xfffffffffffff) == 0 && uVar68 == 0) {
            return;
          }
          if (((uVar46 | 0x1000003d0) & uVar87 & uVar42 & uVar64 & (uVar68 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_340 = (code *)0x157c6b;
        test_inverse_field_cold_2();
        goto LAB_00157c6b;
      }
    }
    else {
      pcStack_340 = (code *)0x157d09;
      test_inverse_field_cold_7();
LAB_00157d09:
      pcStack_340 = (code *)0x157d0e;
      test_inverse_field_cold_6();
LAB_00157d0e:
      pcStack_340 = (code *)0x157d13;
      test_inverse_field_cold_5();
LAB_00157d13:
      a_00 = psVar65;
      psVar60 = psVar63;
      psVar65 = &sStack_2d8;
      pcStack_340 = (code *)0x157d18;
      test_inverse_field_cold_4();
    }
    pcStack_340 = (code *)0x157d1d;
    test_inverse_field_cold_3();
  }
  pcStack_340 = test_inverse_scalar;
  test_inverse_field_cold_1();
  uStack_348 = 0xfffffffffffff;
  uStack_358 = 0x1000003d1;
  pcVar92 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar92 = secp256k1_scalar_inverse;
  }
  psVar63 = (secp256k1_fe *)auStack_3f0;
  psStack_408 = (secp256k1_fe *)0x157d58;
  r_00 = psVar63;
  auStack_388._32_8_ = psVar60;
  auStack_388._40_8_ = pcVar86;
  psStack_350 = psVar65;
  pcStack_340 = (code *)uVar87;
  uVar41 = (*pcVar92)();
  if (r != (secp256k1_fe *)0x0) {
    r->n[2] = CONCAT44(auStack_3f0._20_4_,auStack_3f0._16_4_);
    r->n[3] = CONCAT44(auStack_3f0._28_4_,auStack_3f0._24_4_);
    r->n[0] = CONCAT44(auStack_3f0._4_4_,auStack_3f0._0_4_);
    r->n[1] = CONCAT44(auStack_3f0._12_4_,auStack_3f0._8_4_);
  }
  uVar49 = 0;
  uVar76 = 0;
  uVar81 = 0;
  uVar48 = 0;
  auVar96._0_4_ = -(uint)((int)a_00->n[2] == 0 && (int)a_00->n[0] == 0);
  auVar96._4_4_ = -(uint)(*(int *)((long)a_00->n + 0x14) == 0 && *(int *)((long)a_00->n + 4) == 0);
  auVar96._8_4_ = -(uint)((int)a_00->n[3] == 0 && (int)a_00->n[1] == 0);
  auVar96._12_4_ =
       -(uint)(*(int *)((long)a_00->n + 0x1c) == 0 && *(int *)((long)a_00->n + 0xc) == 0);
  uVar44 = movmskps(uVar41,auVar96);
  uVar44 = uVar44 ^ 0xf;
  if (uVar44 != 0) {
    uVar46 = a_00->n[0];
    uVar87 = a_00->n[1];
    uVar42 = a_00->n[2];
    uVar56 = CONCAT44(auStack_3f0._4_4_,auStack_3f0._0_4_);
    pcVar86 = (code *)CONCAT44(auStack_3f0._12_4_,auStack_3f0._8_4_);
    uVar91 = CONCAT44(auStack_3f0._20_4_,auStack_3f0._16_4_);
    r = (secp256k1_fe *)CONCAT44(auStack_3f0._28_4_,auStack_3f0._24_4_);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar46;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar56;
    uVar52 = SUB168(auVar4 * auVar20,8);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar52;
    sStack_3d0.n[0] = SUB168(auVar4 * auVar20,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar46;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = pcVar86;
    auVar5 = auVar5 * auVar21;
    uVar70 = SUB168(auVar5 + auVar38,0);
    uVar73 = SUB168(auVar5 + auVar38,8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar87;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar56;
    uVar53 = SUB168(auVar6 * auVar22,8);
    uVar69 = SUB168(auVar6 * auVar22,0);
    uVar64 = (ulong)CARRY8(uVar70,uVar69);
    uVar68 = uVar73 + uVar53;
    uVar74 = uVar68 + uVar64;
    uVar77 = (ulong)CARRY8(auVar5._8_8_,(ulong)CARRY8(uVar52,auVar5._0_8_)) +
             (ulong)(CARRY8(uVar73,uVar53) || CARRY8(uVar68,uVar64));
    sStack_3d0.n[1] = uVar70 + uVar69;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar46;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar91;
    uVar54 = SUB168(auVar7 * auVar23,8);
    uVar64 = SUB168(auVar7 * auVar23,0);
    uVar69 = uVar74 + uVar64;
    uVar64 = (ulong)CARRY8(uVar74,uVar64);
    uVar52 = uVar77 + uVar54;
    uVar78 = uVar52 + uVar64;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar87;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = pcVar86;
    uVar74 = SUB168(auVar8 * auVar24,8);
    uVar68 = SUB168(auVar8 * auVar24,0);
    uVar75 = uVar69 + uVar68;
    uVar68 = (ulong)CARRY8(uVar69,uVar68);
    uVar53 = uVar78 + uVar74;
    uVar79 = uVar53 + uVar68;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar42;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar56;
    uVar55 = SUB168(auVar9 * auVar25,8);
    uVar73 = SUB168(auVar9 * auVar25,0);
    uVar69 = (ulong)CARRY8(uVar75,uVar73);
    uVar70 = uVar79 + uVar55;
    uVar80 = uVar70 + uVar69;
    uVar77 = (ulong)(CARRY8(uVar77,uVar54) || CARRY8(uVar52,uVar64)) +
             (ulong)(CARRY8(uVar78,uVar74) || CARRY8(uVar53,uVar68)) +
             (ulong)(CARRY8(uVar79,uVar55) || CARRY8(uVar70,uVar69));
    sStack_3d0.n[2] = uVar75 + uVar73;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar46;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = r;
    uVar73 = SUB168(auVar10 * auVar26,8);
    uVar46 = SUB168(auVar10 * auVar26,0);
    uVar68 = uVar80 + uVar46;
    uVar46 = (ulong)CARRY8(uVar80,uVar46);
    uVar52 = uVar77 + uVar73;
    uVar75 = uVar52 + uVar46;
    pcVar93 = (code *)a_00->n[3];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar87;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar91;
    uVar54 = SUB168(auVar11 * auVar27,8);
    uVar64 = SUB168(auVar11 * auVar27,0);
    uVar69 = uVar68 + uVar64;
    uVar64 = (ulong)CARRY8(uVar68,uVar64);
    uVar53 = uVar75 + uVar54;
    uVar78 = uVar53 + uVar64;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar42;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = pcVar86;
    uVar74 = SUB168(auVar12 * auVar28,8);
    uVar68 = SUB168(auVar12 * auVar28,0);
    uVar80 = uVar69 + uVar68;
    uVar68 = (ulong)CARRY8(uVar69,uVar68);
    uVar70 = uVar78 + uVar74;
    uVar79 = uVar70 + uVar68;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pcVar93;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar56;
    uVar55 = SUB168(auVar13 * auVar29,8);
    uVar69 = SUB168(auVar13 * auVar29,0);
    sStack_3d0.n[3] = uVar80 + uVar69;
    uVar69 = (ulong)CARRY8(uVar80,uVar69);
    uVar56 = uVar79 + uVar55;
    uVar80 = uVar56 + uVar69;
    uVar73 = (ulong)(CARRY8(uVar77,uVar73) || CARRY8(uVar52,uVar46)) +
             (ulong)(CARRY8(uVar75,uVar54) || CARRY8(uVar53,uVar64)) +
             (ulong)(CARRY8(uVar78,uVar74) || CARRY8(uVar70,uVar68)) +
             (ulong)(CARRY8(uVar79,uVar55) || CARRY8(uVar56,uVar69));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar87;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = r;
    uVar53 = SUB168(auVar14 * auVar30,8);
    uVar46 = SUB168(auVar14 * auVar30,0);
    uVar64 = uVar80 + uVar46;
    uVar46 = (ulong)CARRY8(uVar80,uVar46);
    uVar68 = uVar73 + uVar53;
    uVar54 = uVar68 + uVar46;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar42;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar91;
    uVar70 = SUB168(auVar15 * auVar31,8);
    uVar87 = SUB168(auVar15 * auVar31,0);
    uVar52 = uVar64 + uVar87;
    uVar87 = (ulong)CARRY8(uVar64,uVar87);
    uVar69 = uVar54 + uVar70;
    uVar74 = uVar69 + uVar87;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar93;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = pcVar86;
    uVar56 = SUB168(auVar16 * auVar32,8);
    uVar64 = SUB168(auVar16 * auVar32,0);
    sStack_3d0.n[4] = uVar52 + uVar64;
    uVar64 = (ulong)CARRY8(uVar52,uVar64);
    uVar52 = uVar74 + uVar56;
    uVar55 = uVar52 + uVar64;
    uVar52 = (ulong)(CARRY8(uVar73,uVar53) || CARRY8(uVar68,uVar46)) +
             (ulong)(CARRY8(uVar54,uVar70) || CARRY8(uVar69,uVar87)) +
             (ulong)(CARRY8(uVar74,uVar56) || CARRY8(uVar52,uVar64));
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar42;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = r;
    uVar68 = SUB168(auVar17 * auVar33,8);
    uVar46 = SUB168(auVar17 * auVar33,0);
    uVar64 = uVar55 + uVar46;
    uVar46 = (ulong)CARRY8(uVar55,uVar46);
    uVar42 = uVar52 + uVar68;
    uVar53 = uVar42 + uVar46;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = pcVar93;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar91;
    uVar69 = SUB168(auVar18 * auVar34,8);
    uVar87 = SUB168(auVar18 * auVar34,0);
    sStack_3d0._40_8_ = uVar64 + uVar87;
    uVar87 = (ulong)CARRY8(uVar64,uVar87);
    uVar64 = uVar53 + uVar69;
    auStack_3a0._8_8_ =
         (ulong)(CARRY8(uVar52,uVar68) || CARRY8(uVar42,uVar46)) +
         (ulong)(CARRY8(uVar53,uVar69) || CARRY8(uVar64,uVar87));
    auStack_3a0._0_8_ = uVar64 + uVar87;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = pcVar93;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = r;
    auStack_3a0 = auVar19 * auVar35 + auStack_3a0;
    psVar63 = (secp256k1_fe *)auStack_388;
    psStack_408 = (secp256k1_fe *)0x157ef3;
    r_00 = psVar63;
    pcStack_3f8 = pcVar92;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psVar63,(uint64_t *)(auStack_3f0 + 0x20));
    if (((auStack_388._0_8_ != 1 || auStack_388._8_8_ != 0) || auStack_388._16_8_ != 0) ||
        auStack_388._24_8_ != 0) {
      psStack_408 = (secp256k1_fe *)0x157fea;
      test_inverse_scalar_cold_1();
      goto LAB_00157fea;
    }
    psStack_408 = (secp256k1_fe *)0x157f23;
    iVar39 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_3f0 + 0x20),(secp256k1_scalar *)a_00,
                        &scalar_minus_one);
    pcVar92 = pcStack_3f8;
    auVar95._0_4_ = -(uint)((int)sStack_3d0.n[2] == 0 && (int)sStack_3d0.n[0] == 0);
    auVar95._4_4_ = -(uint)(sStack_3d0.n[2]._4_4_ == 0 && sStack_3d0.n[0]._4_4_ == 0);
    auVar95._8_4_ = -(uint)((int)sStack_3d0.n[3] == 0 && (int)sStack_3d0.n[1] == 0);
    auVar95._12_4_ = -(uint)(sStack_3d0.n[3]._4_4_ == 0 && sStack_3d0.n[1]._4_4_ == 0);
    iVar39 = movmskps(iVar39,auVar95);
    if (iVar39 == 0xf) {
      return;
    }
    psVar63 = (secp256k1_fe *)(auStack_3f0 + 0x20);
    psStack_408 = (secp256k1_fe *)0x157f53;
    (*pcStack_3f8)(psVar63,psVar63);
    r = (secp256k1_fe *)auStack_3f0;
    psStack_408 = (secp256k1_fe *)0x157f6a;
    secp256k1_scalar_add((secp256k1_scalar *)r,&scalar_minus_one,(secp256k1_scalar *)r);
    psStack_408 = (secp256k1_fe *)0x157f73;
    (*pcVar92)(r,r);
    psStack_408 = (secp256k1_fe *)0x157f85;
    secp256k1_scalar_add((secp256k1_scalar *)r,(secp256k1_scalar *)r,&secp256k1_scalar_one);
    psStack_408 = (secp256k1_fe *)0x157f93;
    r_00 = r;
    iVar39 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r,(secp256k1_scalar *)psVar63,(secp256k1_scalar *)r);
    auVar97._0_4_ = -(uint)(auStack_3f0._16_4_ == 0 && auStack_3f0._0_4_ == 0);
    auVar97._4_4_ = -(uint)(auStack_3f0._20_4_ == 0 && auStack_3f0._4_4_ == 0);
    auVar97._8_4_ = -(uint)(auStack_3f0._24_4_ == 0 && auStack_3f0._8_4_ == 0);
    auVar97._12_4_ = -(uint)(auStack_3f0._28_4_ == 0 && auStack_3f0._12_4_ == 0);
    iVar39 = movmskps(iVar39,auVar97);
    if (iVar39 == 0xf) {
      return;
    }
    psStack_408 = (secp256k1_fe *)0x157fb7;
    test_inverse_scalar_cold_2();
    uVar44 = extraout_EAX;
    uVar49 = extraout_XMM0_Da;
    uVar76 = extraout_XMM0_Db;
    uVar81 = extraout_XMM0_Dc;
    uVar48 = extraout_XMM0_Dd;
  }
  auVar98._0_4_ = -(uint)((auStack_3f0._16_4_ | auStack_3f0._0_4_) == uVar49);
  auVar98._4_4_ = -(uint)((auStack_3f0._20_4_ | auStack_3f0._4_4_) == uVar76);
  auVar98._8_4_ = -(uint)((auStack_3f0._24_4_ | auStack_3f0._8_4_) == uVar81);
  auVar98._12_4_ = -(uint)((auStack_3f0._28_4_ | auStack_3f0._12_4_) == uVar48);
  iVar39 = movmskps(uVar44,auVar98);
  pcVar93 = pcVar92;
  if (iVar39 == 0xf) {
    return;
  }
LAB_00157fea:
  psStack_408 = (secp256k1_fe *)random_fe;
  test_inverse_scalar_cold_3();
  psStack_430 = psVar63;
  pcStack_428 = pcVar86;
  uStack_420 = uVar91;
  psStack_418 = r;
  pcStack_410 = pcVar93;
  psStack_408 = a_00;
  do {
    secp256k1_testrand256(auStack_458);
    secp256k1_fe_impl_set_b32_mod(r_00,auStack_458);
    bVar36 = (r_00->n[2] & r_00->n[3] & r_00->n[1]) == 0xfffffffffffff;
    bVar37 = r_00->n[4] == 0xffffffffffff;
    bVar94 = 0xffffefffffc2e < r_00->n[0];
    if (bVar94 && (bVar36 && bVar37)) {
      r_00->magnitude = -1;
    }
    else {
      r_00->magnitude = 1;
      r_00->normalized = 1;
      secp256k1_fe_verify(r_00);
    }
  } while (bVar94 && (bVar36 && bVar37));
  return;
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv32_update_fg_30(&f, &g, &t);
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}